

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileStdio::Open
          (FileStdio *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  undefined8 *puVar1;
  _Result<_IO_FILE_*> *p_Var2;
  undefined8 *puVar3;
  int *piVar4;
  FILE *pFVar5;
  char *__modes;
  pointer __filename;
  _State_baseV2 *__tmp;
  __allocator_type __a2;
  allocator local_e9;
  string local_e8;
  pointer local_c8;
  thread local_c0;
  string local_b8;
  __allocator_type __a2_1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pFVar5 = fopen((name->_M_dataplus)._M_p,"rwb");
    this->m_File = (FILE *)pFVar5;
    fseek(pFVar5,0,2);
    goto LAB_005f78eb;
  }
  if (openMode == Read) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    __filename = (name->_M_dataplus)._M_p;
    __modes = "rb";
  }
  else {
    if (openMode != Write) {
      std::__cxx11::string::string((string *)&local_e8,"Toolkit",(allocator *)&local_c0);
      std::__cxx11::string::string
                ((string *)&local_b8,"transport::file::FileStdio",(allocator *)&__a2);
      std::__cxx11::string::string((string *)&local_78,"Open",&local_e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__a2_1,
                     "unknown open mode for file ",__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_e8,&local_b8,&local_78,(string *)&__a2_1,-1);
      std::__cxx11::string::~string((string *)&__a2_1);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_e8);
      goto LAB_005f78eb;
    }
    if (async) {
      this->m_IsOpening = true;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      puVar1 = (undefined8 *)operator_new(0x68);
      puVar1[1] = 0x100000001;
      *puVar1 = &PTR___Sp_counted_ptr_inplace_00823360;
      puVar1[3] = 0;
      *(undefined4 *)(puVar1 + 4) = 0;
      *(undefined1 *)((long)puVar1 + 0x24) = 0;
      *(undefined4 *)(puVar1 + 5) = 0;
      local_e8._M_dataplus._M_p = (pointer)&__a2;
      puVar1[6] = 0;
      *(undefined4 *)(puVar1 + 7) = 0;
      puVar3 = puVar1 + 2;
      puVar1[2] = &PTR___Async_state_impl_008233b0;
      local_e8._M_string_length = (size_type)puVar1;
      p_Var2 = (_Result<_IO_FILE_*> *)operator_new(0x20);
      std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var2);
      puVar1[8] = p_Var2;
      std::__cxx11::string::string((string *)(puVar1 + 9),(string *)name);
      local_c0._M_id._M_thread = (id)0;
      ___a2_1 = (pointer)operator_new(0x20);
      *(undefined ***)___a2_1 = &PTR___State_00823408;
      *(undefined8 **)((long)___a2_1 + 8) = puVar3;
      *(code **)((long)___a2_1 + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>
           ::_M_run;
      *(long *)((long)___a2_1 + 0x18) = 0;
      std::thread::_M_start_thread(&local_c0,&__a2_1,0);
      local_c8 = (pointer)puVar3;
      if ((long *)___a2_1 != (long *)0x0) {
        (**(code **)(*(long *)___a2_1 + 8))();
      }
      std::thread::operator=((thread *)(puVar1 + 6),&local_c0);
      std::thread::~thread(&local_c0);
      local_e8._M_string_length = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_e8);
      local_e8._M_dataplus._M_p = local_b8._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_b8._M_dataplus._M_p = local_c8;
      local_e8._M_string_length = local_b8._M_string_length;
      local_b8._M_string_length = (size_type)puVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
      if (local_b8._M_dataplus._M_p == (pointer)0x0) {
        puVar3 = (undefined8 *)operator_new(0x58);
        puVar3[1] = 0x100000001;
        *puVar3 = &PTR___Sp_counted_ptr_inplace_00823448;
        puVar3[3] = 0;
        local_e8._M_dataplus._M_p = (pointer)&__a2_1;
        *(undefined4 *)(puVar3 + 4) = 0;
        *(undefined1 *)((long)puVar3 + 0x24) = 0;
        *(undefined4 *)(puVar3 + 5) = 0;
        puVar3[2] = &PTR___Deferred_state_00823498;
        local_e8._M_string_length = (size_type)puVar3;
        p_Var2 = (_Result<_IO_FILE_*> *)operator_new(0x20);
        local_c8 = (pointer)(puVar3 + 6);
        std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var2);
        puVar3[6] = p_Var2;
        std::__cxx11::string::string((string *)(puVar3 + 7),(string *)name);
        local_e8._M_string_length = 0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_e8);
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_e8._M_dataplus._M_p = local_b8._M_dataplus._M_p;
        local_e8._M_string_length = local_b8._M_string_length;
        local_b8._M_dataplus._M_p = (pointer)(puVar3 + 2);
        local_b8._M_string_length = (size_type)puVar3;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
      }
      std::__basic_future<_IO_FILE_*>::__basic_future
                ((__basic_future<_IO_FILE_*> *)&local_e8,(__state_type *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
      std::future<_IO_FILE_*>::operator=(&this->m_OpenFuture,(future<_IO_FILE_*> *)&local_e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
      goto LAB_005f78eb;
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    __filename = (name->_M_dataplus)._M_p;
    __modes = "wb";
  }
  pFVar5 = fopen(__filename,__modes);
  this->m_File = (FILE *)pFVar5;
LAB_005f78eb:
  if (this->m_IsOpening == false) {
    std::operator+(&local_e8,"couldn\'t open file ",__rhs);
    std::operator+(&local_50,&local_e8,
                   ", check permissions or path existence, in call to stdio open");
    CheckFile(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_e8);
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileStdio::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }
}